

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatIntTest_Data_Test::TestBody(FormatIntTest_Data_Test *this)

{
  bool bVar1;
  char *expected_expression;
  char *file;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  format_int format_int;
  int in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  format_int *this_01;
  int line;
  allocator *paVar2;
  Type type;
  AssertHelper *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [32];
  Message *in_stack_ffffffffffffffc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  format_int local_28;
  
  this_01 = &local_28;
  fmt::v5::format_int::format_int((format_int *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
  ;
  expected_expression = fmt::v5::format_int::data(this_01);
  file = (char *)fmt::v5::format_int::size((format_int *)0x177e7f);
  paVar2 = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,expected_expression,(ulong)file,paVar2);
  type = (Type)((ulong)paVar2 >> 0x20);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (expected_expression,this_01->buffer_,
             (char (*) [3])CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
  line = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x177f70)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff80,type,file,line,this_01->buffer_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffd0.ptr_,in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x177fbe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x178001);
  return;
}

Assistant:

TEST(FormatIntTest, Data) {
  fmt::format_int format_int(42);
  EXPECT_EQ("42", std::string(format_int.data(), format_int.size()));
}